

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Algebra.h
# Opt level: O1

void Gs::Normalize<Gs::QuaternionT<float>,float>
               (QuaternionT<float> *outVec,QuaternionT<float> *inVec)

{
  float fVar1;
  float fVar2;
  float fVar3;
  size_t i;
  long lVar4;
  float result;
  float fVar5;
  
  fVar5 = 0.0;
  lVar4 = 0;
  do {
    fVar5 = fVar5 + (&inVec->x)[lVar4] * (&inVec->x)[lVar4];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 4);
  if (((fVar5 == 0.0) && (!NAN(fVar5))) || ((fVar5 == 1.0 && (!NAN(fVar5))))) {
    fVar5 = inVec->y;
    fVar1 = inVec->z;
    fVar2 = inVec->w;
    outVec->x = inVec->x;
    outVec->y = fVar5;
    outVec->z = fVar1;
    outVec->w = fVar2;
  }
  else {
    if (fVar5 < 0.0) {
      fVar5 = sqrtf(fVar5);
    }
    else {
      fVar5 = SQRT(fVar5);
    }
    fVar5 = 1.0 / fVar5;
    fVar1 = inVec->y;
    fVar2 = inVec->z;
    fVar3 = inVec->w;
    outVec->x = inVec->x * fVar5;
    outVec->y = fVar1 * fVar5;
    outVec->z = fVar2 * fVar5;
    outVec->w = fVar5 * fVar3;
  }
  return;
}

Assistant:

void Normalize(TVector& outVec, const TVector& inVec)
{
    TScalar len = LengthSq<TVector, TScalar>(inVec);
    if (len != TScalar(0) && len != TScalar(1))
    {
        len = TScalar(1) / std::sqrt(len);
        outVec = inVec * len;
    }
    else
        outVec = inVec;
}